

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_content.cpp
# Opt level: O3

ON_Environment * __thiscall
ON_RenderEnvironment::ToOnEnvironment
          (ON_Environment *__return_storage_ptr__,ON_RenderEnvironment *this)

{
  bool bVar1;
  int iVar2;
  anon_union_4_2_6147a14e_for_ON_Color_15 aVar3;
  BackgroundProjections BVar4;
  ON_XMLNode *node;
  wchar_t *pwVar5;
  recursive_mutex *__mutex;
  ON_XMLParameters p;
  ON_XMLVariant v;
  ON_Texture tex;
  undefined1 local_330 [24];
  ON_XMLVariant local_318;
  ON_Texture local_220;
  
  __mutex = &((this->super_ON_RenderContent)._private)->m_mutex;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 == 0) {
    ON_Environment::ON_Environment(__return_storage_ptr__);
    node = ON_XMLNode::GetNamedChild
                     (&((this->super_ON_RenderContent)._private)->m_node,L"simulation");
    if (node != (ON_XMLNode *)0x0) {
      ::ON_XMLVariant::ON_XMLVariant(&local_318);
      ON_XMLParameters::ON_XMLParameters((ON_XMLParameters *)(local_330 + 8),node);
      bVar1 = ON_XMLParameters::GetParam
                        ((ON_XMLParameters *)(local_330 + 8),L"background-color",&local_318);
      if (bVar1) {
        local_220.super_ON_Object = (ON_Object)::ON_XMLVariant::AsColor(&local_318);
        aVar3 = (anon_union_4_2_6147a14e_for_ON_Color_15)
                ON_4fColor::operator_cast_to_ON_Color((ON_4fColor *)&local_220);
        *(anon_union_4_2_6147a14e_for_ON_Color_15 *)__return_storage_ptr__->m_impl = aVar3;
      }
      bVar1 = ON_XMLParameters::GetParam
                        ((ON_XMLParameters *)(local_330 + 8),L"background-image",&local_318);
      if (bVar1) {
        ON_Texture::ON_Texture(&local_220);
        ::ON_XMLVariant::AsString((ON_XMLVariant *)local_330);
        pwVar5 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_330);
        ON_FileReference::SetFullPath(&local_220.m_image_file_reference,pwVar5,false);
        ON_wString::~ON_wString((ON_wString *)local_330);
        ON_Texture::operator=(&__return_storage_ptr__->m_impl->m_back_image,&local_220);
        ON_Texture::~ON_Texture(&local_220);
      }
      bVar1 = ON_XMLParameters::GetParam
                        ((ON_XMLParameters *)(local_330 + 8),L"background-projection",&local_318);
      if (bVar1) {
        ::ON_XMLVariant::AsString((ON_XMLVariant *)&local_220);
        pwVar5 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)&local_220);
        BVar4 = ON_Environment::ProjectionFromString(pwVar5);
        ON_wString::~ON_wString((ON_wString *)&local_220);
        __return_storage_ptr__->m_impl->m_back_proj = BVar4;
      }
      ON_XMLParameters::~ON_XMLParameters((ON_XMLParameters *)(local_330 + 8));
      ::ON_XMLVariant::~ON_XMLVariant(&local_318);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return __return_storage_ptr__;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

ON_Environment ON_RenderEnvironment::ToOnEnvironment(void) const
{
  std::lock_guard<std::recursive_mutex> lg(_private->m_mutex);

  ON_Environment env;

  const ON_XMLNode* sim_node = _private->XMLNode_Simulation();
  if (nullptr != sim_node)
  {
    ON_XMLVariant v;
    ON_XMLParameters p(*sim_node);

    if (p.GetParam(ON_ENVIRONMENT_SIMULATION_BACKGROUND_COLOR, v))
      env.SetBackgroundColor(v.AsColor());

    if (p.GetParam(ON_ENVIRONMENT_SIMULATION_BACKGROUND_IMAGE, v))
    {
      ON_Texture tex;
      tex.m_image_file_reference.SetFullPath(v.AsString(), false);
      env.SetBackgroundImage(tex);

      // TODO: More? Andy is thinking about this.
    }

    if (p.GetParam(ON_ENVIRONMENT_SIMULATION_BACKGROUND_PROJECTION, v))
    {
      const auto proj = ON_Environment::ProjectionFromString(v.AsString());
      env.SetBackgroundProjection(proj);
    }
  }

  return env;
}